

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

ostream * std::operator<<(ostream *ofs,Reference *v)

{
  allocator local_61;
  string local_60;
  string local_40;
  
  operator<<(ofs,&v->asset_path);
  if ((v->prim_path)._valid == true) {
    operator<<(ofs,&v->prim_path);
  }
  operator<<(ofs,&v->layerOffset);
  if ((v->customData)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::string::string((string *)&local_60,"customData",&local_61);
    tinyusdz::print_customData(&local_40,&v->customData,&local_60,0);
    std::operator<<(ofs,(string *)&local_40);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const tinyusdz::Reference &v) {
  ofs << v.asset_path;
  if (v.prim_path.is_valid()) {
    ofs << v.prim_path;
  }
  ofs << v.layerOffset;
  if (!v.customData.empty()) {
    ofs << tinyusdz::print_customData(v.customData, "customData",
                                      /* indent */ 0);
  }

  return ofs;
}